

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O1

double GenNorm(double *x,cupdlp_int n,cupdlp_float p)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  if ((p != 2.0) || (NAN(p))) {
    if (p < INFINITY) {
      if (n < 1) {
        dVar2 = 0.0;
      }
      else {
        dVar2 = 0.0;
        uVar1 = 0;
        do {
          dVar3 = pow(ABS(x[uVar1]),p);
          dVar2 = dVar2 + dVar3;
          uVar1 = uVar1 + 1;
        } while ((uint)n != uVar1);
      }
      dVar2 = pow(dVar2,1.0 / p);
      return dVar2;
    }
    if (n < 1) {
      dVar2 = 0.0;
    }
    else {
      uVar1 = 0;
      dVar3 = 0.0;
      do {
        dVar2 = ABS(x[uVar1]);
        if (ABS(x[uVar1]) <= dVar3) {
          dVar2 = dVar3;
        }
        uVar1 = uVar1 + 1;
        dVar3 = dVar2;
      } while ((uint)n != uVar1);
    }
  }
  else {
    dVar2 = 0.0;
    if (0 < n) {
      uVar1 = 0;
      do {
        dVar2 = dVar2 + x[uVar1] * x[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)n != uVar1);
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
      return dVar2;
    }
    dVar2 = SQRT(dVar2);
  }
  return dVar2;
}

Assistant:

double GenNorm(double *x, cupdlp_int n, cupdlp_float p) {
  if (p == 2.0) {
    return twoNorm(x, n);
  } else if (p == INFINITY) {
    return infNorm(x, n);
  } else {
    double nrm = 0.0;

    for (int i = 0; i < n; ++i) {
      nrm += pow(fabs(x[i]), p);
    }

    return pow(nrm, 1.0 / p);
  }
}